

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_bsp.cpp
# Opt level: O2

void swrenderer::R_ClearDrawSegs(void)

{
  if (drawsegs == (void *)0x0) {
    MaxDrawSegs = 0x100;
    drawsegs = M_Malloc_Dbg(0x9800,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/r_bsp.cpp"
                            ,0x78);
    firstdrawseg = drawsegs;
  }
  FirstInterestingDrawseg = 0;
  TArray<unsigned_long,_unsigned_long>::Clear
            ((TArray<unsigned_long,_unsigned_long> *)&InterestingDrawsegs);
  ds_p = drawsegs;
  return;
}

Assistant:

void R_ClearDrawSegs (void)
{
	if (drawsegs == NULL)
	{
		MaxDrawSegs = 256;		// [RH] Default. Increased as needed.
		firstdrawseg = drawsegs = (drawseg_t *)M_Malloc (MaxDrawSegs * sizeof(drawseg_t));
	}
	FirstInterestingDrawseg = 0;
	InterestingDrawsegs.Clear ();
	ds_p = drawsegs;
}